

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::setIndex(QUndoStack *this,int idx)

{
  QUndoStackPrivate *this_00;
  ulong uVar1;
  byte bVar2;
  QUndoCommand *pQVar3;
  long i;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QUndoStackPrivate **)&this->field_0x8;
  if ((this_00->macro_stack).d.size == 0) {
    if (idx < 0) {
      uVar6 = 0;
    }
    else {
      uVar1 = (this_00->command_list).d.size;
      uVar6 = uVar1 & 0xffffffff;
      if ((uint)idx <= uVar1) {
        uVar6 = (ulong)(uint)idx;
      }
    }
    iVar5 = this_00->index;
    do {
      i = (long)iVar5;
      uVar6 = (ulong)(int)uVar6;
      while( true ) {
        if ((int)uVar6 <= iVar5) goto LAB_0056205e;
        pQVar3 = (this_00->command_list).d.ptr[i];
        bVar2 = pQVar3->d->obsolete;
        if ((bool)bVar2 == false) {
          (*pQVar3->_vptr_QUndoCommand[3])(pQVar3);
          bVar2 = pQVar3->d->obsolete;
        }
        if ((bVar2 & 1) == 0) break;
        pQVar3 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,i);
        if (pQVar3 != (QUndoCommand *)0x0) {
          (*pQVar3->_vptr_QUndoCommand[1])(pQVar3);
        }
        if (iVar5 < this_00->clean_index) {
          resetClean(this);
        }
        uVar6 = uVar6 - 1;
      }
      iVar5 = iVar5 + 1;
    } while( true );
  }
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_40 = "default";
  QMessageLogger::warning
            (local_58,"QUndoStack::setIndex(): cannot set index in the middle of a macro");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005620dc:
  __stack_chk_fail();
LAB_0056205e:
  while (lVar4 = i, (long)uVar6 < lVar4) {
    i = lVar4 + -1;
    pQVar3 = (this_00->command_list).d.ptr[lVar4 + -1];
    (*pQVar3->_vptr_QUndoCommand[2])(pQVar3);
    if (pQVar3->d->obsolete == true) {
      pQVar3 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,i);
      if (pQVar3 != (QUndoCommand *)0x0) {
        (*pQVar3->_vptr_QUndoCommand[1])(pQVar3);
      }
      if (lVar4 <= this_00->clean_index) {
        resetClean(this);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QUndoStackPrivate::setIndex(this_00,(int)uVar6,false);
    return;
  }
  goto LAB_005620dc;
}

Assistant:

void QUndoStack::setIndex(int idx)
{
    Q_D(QUndoStack);
    if (Q_UNLIKELY(!d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::setIndex(): cannot set index in the middle of a macro");
        return;
    }

    if (idx < 0)
        idx = 0;
    else if (idx > d->command_list.size())
        idx = d->command_list.size();

    int i = d->index;
    while (i < idx) {
        QUndoCommand *cmd = d->command_list.at(i);

        if (!cmd->isObsolete())
            cmd->redo();  // A separate check is done b/c the undo command may set obsolete flag

        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();

            idx--; // Subtract from idx because we removed a command
        } else {
            i++;
        }
    }

    while (i > idx) {
        QUndoCommand *cmd = d->command_list.at(--i);

        cmd->undo();
        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();
        }
    }

    d->setIndex(idx, false);
}